

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deThreadTest.c
# Opt level: O0

void threadTestThr3(void *arg)

{
  deBool dVar1;
  int local_1c;
  int ndx;
  ThreadData3 *data;
  void *arg_local;
  
  for (local_1c = 0; local_1c < 0x10; local_1c = local_1c + 1) {
    do {
      dVar1 = deGetFalse();
      if ((dVar1 != 0) || (*(char *)((long)arg + (long)local_1c) != '\0')) {
        deAssertFail("data->bytes[ndx] == 0",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/dethread/deThreadTest.c"
                     ,0x3b);
      }
      dVar1 = deGetFalse();
    } while (dVar1 != 0);
  }
  for (local_1c = 0; local_1c < 0x10; local_1c = local_1c + 1) {
    *(undefined1 *)((long)arg + (long)local_1c) = 0xff;
  }
  return;
}

Assistant:

static void threadTestThr3 (void* arg)
{
	ThreadData3* data = (ThreadData3*)arg;
	int ndx;

	for (ndx = 0; ndx < (int)DE_LENGTH_OF_ARRAY(data->bytes); ndx++)
		DE_TEST_ASSERT(data->bytes[ndx] == 0);

	for (ndx = 0; ndx < (int)DE_LENGTH_OF_ARRAY(data->bytes); ndx++)
		data->bytes[ndx] = 0xff;
}